

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O0

bool __thiscall dg::pta::PointerAnalysisFS::afterProcessed(PointerAnalysisFS *this,PSNode *n)

{
  bool bVar1;
  PSNodeType PVar2;
  PSNodeCallRet *this_00;
  reference ppPVar3;
  PSNode *in_RSI;
  MemoryMapT *pm_2;
  PSNode *p_2;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__range4_1;
  PSNodeEntry *E;
  MemoryMapT *pm_1;
  PSNode *p_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__range4;
  PSNodeCallRet *CR;
  MemoryMapT *pm;
  PSNode *p;
  const_iterator __end3;
  const_iterator __begin3;
  NodesVec *__range3;
  MemoryMapT *mm;
  PointsToSetT *overwritten;
  bool changed;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffff48;
  PSNode *in_stack_ffffffffffffff50;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_98;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *local_90;
  PSNodeEntry *local_88;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *local_80;
  PSNode *local_78;
  PSNode **local_70;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  in_stack_ffffffffffffff98;
  PointsToSetT *in_stack_ffffffffffffffa0;
  MemoryMapT *in_stack_ffffffffffffffa8;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_38;
  NodesVec *local_30;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *local_28;
  PSNode *local_20;
  byte local_11;
  PSNode *local_10;
  
  local_11 = 0;
  local_20 = (PSNode *)0x0;
  local_10 = in_RSI;
  local_28 = SubgraphNode<dg::pta::PSNode>::
             getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                       ((SubgraphNode<dg::pta::PSNode> *)(in_RSI + 8));
  PVar2 = PSNode::getType(local_10);
  if (PVar2 == STORE) {
    SubgraphNode<dg::pta::PSNode>::getOperand
              ((SubgraphNode<dg::pta::PSNode> *)in_stack_ffffffffffffff50,
               (size_t)in_stack_ffffffffffffff48);
    bVar1 = pointsToAllocationInLoop((PSNode *)in_stack_ffffffffffffff98._M_current);
    if (!bVar1) {
      local_20 = SubgraphNode<dg::pta::PSNode>::getOperand
                           ((SubgraphNode<dg::pta::PSNode> *)in_stack_ffffffffffffff50,
                            (size_t)in_stack_ffffffffffffff48);
      local_20 = local_20 + 0xb0;
    }
  }
  bVar1 = needsMerge(in_stack_ffffffffffffff50);
  if (bVar1) {
    local_30 = SubgraphNode<dg::pta::PSNode>::predecessors
                         ((SubgraphNode<dg::pta::PSNode> *)(local_10 + 8));
    local_38._M_current =
         (PSNode **)
         std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                   (in_stack_ffffffffffffff48);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
              (in_stack_ffffffffffffff48);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)in_stack_ffffffffffffff50,
                              (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)in_stack_ffffffffffffff48), bVar1) {
      ppPVar3 = __gnu_cxx::
                __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                ::operator*(&local_38);
      in_stack_ffffffffffffffb0 =
           SubgraphNode<dg::pta::PSNode>::
           getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                     ((SubgraphNode<dg::pta::PSNode> *)(*ppPVar3 + 8));
      if (in_stack_ffffffffffffffb0 !=
          (map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
           *)0x0) {
        bVar1 = mergeMaps(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
        local_11 = (local_11 & 1) != 0 || bVar1;
      }
      __gnu_cxx::
      __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
      ::operator++(&local_38);
    }
    this_00 = PSNodeCallRet::get(in_stack_ffffffffffffff50);
    if (this_00 != (PSNodeCallRet *)0x0) {
      in_stack_ffffffffffffffa0 = (PointsToSetT *)PSNodeCallRet::getReturns(this_00);
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                (in_stack_ffffffffffffff48);
      local_70 = (PSNode **)
                 std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                           (in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_ffffffffffffff50,
                                (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_ffffffffffffff48), bVar1) {
        ppPVar3 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)&stack0xffffffffffffff98);
        local_78 = *ppPVar3;
        local_80 = SubgraphNode<dg::pta::PSNode>::
                   getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                             ((SubgraphNode<dg::pta::PSNode> *)(local_78 + 8));
        if (local_80 !=
            (map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
             *)0x0) {
          bVar1 = mergeMaps(in_stack_ffffffffffffffb0,(MemoryMapT *)this_00,
                            in_stack_ffffffffffffffa0);
          local_11 = (local_11 & 1) != 0 || bVar1;
        }
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                      *)&stack0xffffffffffffff98);
      }
    }
    local_88 = PSNodeEntry::get(in_stack_ffffffffffffff50);
    if (local_88 != (PSNodeEntry *)0x0) {
      local_90 = PSNodeEntry::getCallers(local_88);
      local_98._M_current =
           (PSNode **)
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                     (in_stack_ffffffffffffff48);
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                (in_stack_ffffffffffffff48);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_ffffffffffffff50,
                                (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_ffffffffffffff48), bVar1) {
        ppPVar3 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*(&local_98);
        in_stack_ffffffffffffff50 =
             (PSNode *)
             SubgraphNode<dg::pta::PSNode>::
             getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                       ((SubgraphNode<dg::pta::PSNode> *)(*ppPVar3 + 8));
        if (in_stack_ffffffffffffff50 != (PSNode *)0x0) {
          bVar1 = mergeMaps(in_stack_ffffffffffffffb0,(MemoryMapT *)this_00,
                            in_stack_ffffffffffffffa0);
          local_11 = (local_11 & 1) != 0 || bVar1;
        }
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++(&local_98);
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool afterProcessed(PSNode *n) override {
        bool changed = false;
        PointsToSetT *overwritten = nullptr;

        MemoryMapT *mm = n->getData<MemoryMapT>();
        // we must have the memory map, we created it
        // in the beforeProcessed method
        assert(mm && "Do not have memory map");

        // every store that stores to a memory allocated
        // not in a loop is a strong update
        // FIXME: memcpy can be strong update too
        if (n->getType() == PSNodeType::STORE) {
            if (!pointsToAllocationInLoop(n->getOperand(1)))
                overwritten = &n->getOperand(1)->pointsTo;
        }

        // merge information from predecessors if there's
        // more of them (if there's just one predecessor
        // and this is not a store, the memory map couldn't
        // change, so we don't have to do that)
        if (needsMerge(n)) {
            for (PSNode *p : n->predecessors()) {
                if (MemoryMapT *pm = p->getData<MemoryMapT>()) {
                    // merge pm to mm (but only if pm was already created)
                    changed |= mergeMaps(mm, pm, overwritten);
                }
            }

            // interprocedural stuff - merge information from calls
            if (auto *CR = PSNodeCallRet::get(n)) {
                for (auto *p : CR->getReturns()) {
                    if (MemoryMapT *pm = p->getData<MemoryMapT>()) {
                        // merge pm to mm (but only if pm was already created)
                        changed |= mergeMaps(mm, pm, overwritten);
                    }
                }
            }
            if (auto *E = PSNodeEntry::get(n)) {
                for (auto *p : E->getCallers()) {
                    if (MemoryMapT *pm = p->getData<MemoryMapT>()) {
                        // merge pm to mm (but only if pm was already created)
                        changed |= mergeMaps(mm, pm, overwritten);
                    }
                }
            }
        }

        return changed;
    }